

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.cc
# Opt level: O0

bool __thiscall
re2::RE2::Set::Match(Set *this,StringPiece *text,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_4b8;
  LogMessage local_338;
  byte local_1b6;
  bool local_1b5 [7];
  bool ret;
  bool failed;
  LogMessage local_1a8;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *v_local;
  StringPiece *text_local;
  Set *this_local;
  
  local_28 = v;
  v_local = (vector<int,_std::allocator<int>_> *)text;
  text_local = (StringPiece *)this;
  if ((this->compiled_ & 1U) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x60);
    poVar2 = LogMessage::stream(&local_1a8);
    std::operator<<(poVar2,"RE2::Set::Match without Compile");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a8);
    this_local._7_1_ = false;
  }
  else {
    if (v != (vector<int,_std::allocator<int>_> *)0x0) {
      std::vector<int,_std::allocator<int>_>::clear(v);
    }
    local_1b6 = Prog::SearchDFA(this->prog_,(StringPiece *)v_local,(StringPiece *)v_local,kAnchored,
                                kManyMatch,(StringPiece *)0x0,local_1b5,local_28);
    if ((local_1b5[0] & 1U) != 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_338,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x69)
      ;
      poVar2 = LogMessage::stream(&local_338);
      std::operator<<(poVar2,"RE2::Set::Match: DFA ran out of cache space");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_338);
    }
    if ((local_1b6 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else if ((local_28 == (vector<int,_std::allocator<int>_> *)0x0) ||
            (bVar1 = std::vector<int,_std::allocator<int>_>::empty(local_28), !bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/set.cc",0x6e)
      ;
      poVar2 = LogMessage::stream(&local_4b8);
      std::operator<<(poVar2,"RE2::Set::Match: match but unknown regexp set");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4b8);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RE2::Set::Match(const StringPiece& text, vector<int>* v) const {
  if (!compiled_) {
    LOG(DFATAL) << "RE2::Set::Match without Compile";
    return false;
  }
  if (v != NULL)
    v->clear();
  bool failed;
  bool ret = prog_->SearchDFA(text, text, Prog::kAnchored,
                              Prog::kManyMatch, NULL, &failed, v);
  if (failed)
    LOG(DFATAL) << "RE2::Set::Match: DFA ran out of cache space";

  if (ret == false)
    return false;
  if (v != NULL && v->empty()) {
    LOG(DFATAL) << "RE2::Set::Match: match but unknown regexp set";
    return false;
  }
  return true;
}